

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_shake.h
# Opt level: O0

void hash_update_x4_uint16s_le(hash_context_x4 *ctx,uint16_t *data)

{
  __uint16_t *in_RSI;
  uint16_t data3_le;
  uint16_t data2_le;
  uint16_t data1_le;
  uint16_t data0_le;
  uint8_t *in_stack_00000018;
  uint8_t *in_stack_00000020;
  uint8_t *in_stack_00000028;
  hash_context_x4 *in_stack_00000030;
  
  __uint16_identity(*in_RSI);
  __uint16_identity(in_RSI[1]);
  __uint16_identity(in_RSI[2]);
  __uint16_identity(in_RSI[3]);
  hash_update_x4_4(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                   (uint8_t *)ctx,(size_t)data);
  return;
}

Assistant:

static inline void hash_update_x4_uint16s_le(hash_context_x4* ctx, const uint16_t data[4]) {
  const uint16_t data0_le = htole16(data[0]);
  const uint16_t data1_le = htole16(data[1]);
  const uint16_t data2_le = htole16(data[2]);
  const uint16_t data3_le = htole16(data[3]);
  hash_update_x4_4(ctx, (const uint8_t*)&data0_le, (const uint8_t*)&data1_le,
                   (const uint8_t*)&data2_le, (const uint8_t*)&data3_le, sizeof(data[0]));
}